

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  ExtensionSet *const_this;
  LogFinisher local_69;
  LogMessage local_68;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    pMVar5 = (MessageLite *)0x0;
  }
  else {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x30e);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x30e);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    pMVar5 = (pEVar3->field_0).message_value;
    if ((pEVar3->field_0xa & 0x10) != 0) {
      iVar2 = (*pMVar5->_vptr_MessageLite[8])(pMVar5,prototype,this->arena_);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
      if ((this->arena_ == (Arena *)0x0) && ((pEVar3->field_0).message_value != (MessageLite *)0x0))
      {
        (*((pEVar3->field_0).message_value)->_vptr_MessageLite[1])();
      }
    }
    Erase(this,number);
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    int number, const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->UnsafeArenaReleaseMessage(prototype,
                                                                    arena_);
      if (arena_ == nullptr) {
        delete extension->lazymessage_value;
      }
    } else {
      ret = extension->message_value;
    }
    Erase(number);
    return ret;
  }
}